

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_4,_2> *value)

{
  Vector<float,_4> *in_RCX;
  long lVar1;
  long lVar2;
  IVal *pIVar3;
  bool *pbVar4;
  byte bVar5;
  IVal local_90;
  
  bVar5 = 0;
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(__return_storage_ptr__);
  for (lVar2 = 0; lVar2 != 0xc0; lVar2 = lVar2 + 0x60) {
    round<tcu::Vector<float,4>>(&local_90,(BuiltinPrecisionTests *)fmt,(FloatFormat *)value,in_RCX);
    pIVar3 = &local_90;
    pbVar4 = &(__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN + lVar2;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)pbVar4 = *(undefined8 *)pIVar3->m_data;
      pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      pbVar4 = pbVar4 + ((ulong)bVar5 * -2 + 1) * 8;
    }
    value = (Matrix<float,_4,_2> *)&((FloatFormat *)value)->m_hasInf;
    in_RCX = (Vector<float,_4> *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}